

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

ostream * slang::operator<<(ostream *os,logic_t *rhs)

{
  byte *in_RSI;
  ostream *in_RDI;
  
  if (*in_RSI == 0x80) {
    std::operator<<(in_RDI,"x");
  }
  else if (*in_RSI == 0x40) {
    std::operator<<(in_RDI,"z");
  }
  else {
    std::ostream::operator<<(in_RDI,(uint)*in_RSI);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const logic_t& rhs) {
    if (rhs.value == logic_t::x.value)
        os << "x";
    else if (rhs.value == logic_t::z.value)
        os << "z";
    else
        os << (uint32_t)rhs.value;
    return os;
}